

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# row_common.cc
# Opt level: O0

void ARGBToAR30Row_C(uint8_t *src_argb,uint8_t *dst_ar30,int width)

{
  uint32_t a0;
  uint32_t r0;
  uint32_t g0;
  uint32_t b0;
  int x;
  int width_local;
  uint8_t *dst_ar30_local;
  uint8_t *src_argb_local;
  
  dst_ar30_local = dst_ar30;
  src_argb_local = src_argb;
  for (x = 0; x < width; x = x + 1) {
    *(uint *)dst_ar30_local =
         (int)(uint)*src_argb_local >> 6 | (uint)*src_argb_local << 2 |
         ((int)(uint)src_argb_local[1] >> 6 | (uint)src_argb_local[1] << 2) << 10 |
         ((int)(uint)src_argb_local[2] >> 6 | (uint)src_argb_local[2] << 2) << 0x14 |
         ((int)(uint)src_argb_local[3] >> 6) << 0x1e;
    dst_ar30_local = dst_ar30_local + 4;
    src_argb_local = src_argb_local + 4;
  }
  return;
}

Assistant:

void ARGBToAR30Row_C(const uint8_t* src_argb, uint8_t* dst_ar30, int width) {
  int x;
  for (x = 0; x < width; ++x) {
    uint32_t b0 = (src_argb[0] >> 6) | ((uint32_t)(src_argb[0]) << 2);
    uint32_t g0 = (src_argb[1] >> 6) | ((uint32_t)(src_argb[1]) << 2);
    uint32_t r0 = (src_argb[2] >> 6) | ((uint32_t)(src_argb[2]) << 2);
    uint32_t a0 = (src_argb[3] >> 6);
    *(uint32_t*)(dst_ar30) = b0 | (g0 << 10) | (r0 << 20) | (a0 << 30);
    dst_ar30 += 4;
    src_argb += 4;
  }
}